

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

int __thiscall Console::step(Console *this)

{
  int iVar1;
  CPU *unaff_retaddr;
  int i;
  int cpu_cycles;
  int frame;
  undefined4 local_14;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = CPU::execute(unaff_retaddr);
  for (local_14 = 0; SBORROW4(local_14,iVar1 * 3) != local_14 + iVar1 * -3 < 0;
      local_14 = local_14 + 1) {
    iVar2 = PPU::execute((PPU *)CONCAT44(iVar2,iVar1));
  }
  return iVar2;
}

Assistant:

int Console::step() {
    int frame = 0;
    int cpu_cycles = cpu->execute();
    for (int i = 0; i < (3*cpu_cycles); ++i) {
    	frame = ppu->execute();
    }
    return frame;
}